

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_operator.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformAExprInternal(Transformer *this,PGAExpr *root)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var3;
  ParserOptions *pPVar4;
  long lVar5;
  undefined8 uVar6;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var7;
  ExpressionType EVar8;
  int iVar9;
  __uniq_ptr_impl<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>_>
  this_00;
  SelectNode *this_01;
  pointer pSVar10;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var11;
  pointer pSVar12;
  pointer pSVar13;
  type expr;
  undefined1 this_02 [8];
  BaseExpression *pBVar14;
  FunctionExpression *pFVar15;
  reference pvVar16;
  pointer pPVar17;
  ConstantExpression *pCVar18;
  Transformer *pTVar19;
  InternalException *this_03;
  ParserException *this_04;
  NotImplementedException *pNVar20;
  long in_RDX;
  pointer *__ptr;
  PGAExpr *op;
  string *op_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var21;
  _Alloc_hider _Var22;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_05;
  optional_ptr<duckdb_libpgquery::PGList,_true> between_args;
  char *regex_function;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  left_expr;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children_2;
  string name;
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_110;
  undefined1 local_108 [32];
  string local_e8;
  undefined1 local_c0 [48];
  undefined1 local_90 [16];
  undefined1 local_80 [40];
  __node_base _Stack_58;
  undefined1 local_50 [32];
  
  local_e8._M_dataplus._M_p = (pointer)**(undefined8 **)(*(long *)(in_RDX + 8) + 8);
  optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
            ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)(local_108 + 0x20));
  ::std::__cxx11::string::string
            ((string *)local_90,
             &(*(ParserOptions **)(local_e8._M_dataplus._M_p + 8))->preserve_identifier_case,
             (allocator *)local_108);
  switch(*(undefined4 *)(in_RDX + 4)) {
  case 1:
  case 2:
    TransformExpression((Transformer *)(local_128 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    TransformExpression((Transformer *)local_c0,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root)
    ;
    this_00._M_t.
    super__Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
    .super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl =
         (tuple<duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>)
         operator_new(0x58);
    SubqueryExpression::SubqueryExpression
              ((SubqueryExpression *)
               this_00._M_t.
               super__Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
               .super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl);
    local_118 = (undefined1  [8])
                this_00._M_t.
                super__Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
                .super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl;
    local_110._M_head_impl = (SelectStatement *)operator_new(0x80);
    ((local_110._M_head_impl)->super_SQLStatement).type = SELECT_STATEMENT;
    ((local_110._M_head_impl)->super_SQLStatement).stmt_location = 0;
    ((local_110._M_head_impl)->super_SQLStatement).stmt_length = 0;
    ((local_110._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_buckets =
         &((local_110._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_single_bucket;
    ((local_110._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
    ((local_110._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    ((local_110._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
    ((local_110._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_rehash_policy.
    _M_max_load_factor = 1.0;
    ((local_110._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_rehash_policy.
    _M_next_resize = 0;
    ((local_110._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_single_bucket =
         (__node_base_ptr)0x0;
    ((local_110._M_head_impl)->super_SQLStatement).query._M_dataplus._M_p =
         (pointer)&((local_110._M_head_impl)->super_SQLStatement).query.field_2;
    ((local_110._M_head_impl)->super_SQLStatement).query._M_string_length = 0;
    ((local_110._M_head_impl)->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
    ((local_110._M_head_impl)->super_SQLStatement)._vptr_SQLStatement =
         (_func_int **)&PTR__SelectStatement_01981db8;
    ((local_110._M_head_impl)->node).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    this_01 = (SelectNode *)operator_new(0xf0);
    SelectNode::SelectNode(this_01);
    local_108._0_8_ =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
    local_108._8_8_ = (_Hash_node_base *)0x0;
    local_108._16_8_ = (pointer)0x0;
    local_c0._8_8_ = this_01;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)local_108,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_c0);
    pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)(local_c0 + 8));
    make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)local_128,(char (*) [7])0x132570d,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)local_108);
    local_e8._M_dataplus._M_p = (pointer)local_128._0_8_;
    local_128._0_8_ = (Transformer *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar10->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_108 + 0x20));
    if ((Transformer *)local_e8._M_dataplus._M_p != (Transformer *)0x0) {
      (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
    }
    local_e8._M_dataplus._M_p = (pointer)0x0;
    if ((Transformer *)local_128._0_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_128._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    _Var11._M_head_impl = (TableRef *)operator_new(0x68);
    (_Var11._M_head_impl)->type = EMPTY_FROM;
    ((_Var11._M_head_impl)->alias)._M_dataplus =
         (_Alloc_hider)&((_Var11._M_head_impl)->alias).field_2;
    ((_Var11._M_head_impl)->alias)._M_string_length = 0;
    ((_Var11._M_head_impl)->alias).field_2._M_local_buf[0] = '\0';
    ((_Var11._M_head_impl)->sample).
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> =
         (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)0x0;
    ((_Var11._M_head_impl)->query_location).index = 0xffffffffffffffff;
    *(undefined8 *)&((_Var11._M_head_impl)->external_dependency).internal = 0;
    ((_Var11._M_head_impl)->external_dependency).internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)
     &((_Var11._M_head_impl)->column_name_alias).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         = 0;
    ((_Var11._M_head_impl)->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((_Var11._M_head_impl)->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (_Var11._M_head_impl)->_vptr_TableRef = (_func_int **)&PTR__TableRef_01982330;
    pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)(local_c0 + 8));
    _Var1._M_head_impl =
         (pSVar10->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar10->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var11._M_head_impl;
    if (_Var1._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
    }
    uVar6 = local_c0._8_8_;
    local_c0._8_8_ = (ParserOptions *)0x0;
    pSVar12 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)&local_110);
    _Var2._M_head_impl =
         (pSVar12->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar12->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)uVar6;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    }
    pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)local_118);
    _Var7._M_head_impl = local_110._M_head_impl;
    local_110._M_head_impl = (SelectStatement *)0x0;
    _Var3._M_head_impl =
         (pSVar13->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar13->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var3._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_SQLStatement + 8))();
    }
    pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)local_118);
    pSVar13->subquery_type = ANY;
    pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)local_118);
    uVar6 = local_128._8_8_;
    local_128._8_8_ = (Transformer *)0x0;
    _Var21._M_head_impl =
         (pSVar13->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar13->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar6;
    if (_Var21._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var21._M_head_impl)->super_BaseExpression + 8))();
    }
    EVar8 = OperatorToExpressionType((string *)local_90);
    pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)local_118);
    pSVar13->comparison_type = EVar8;
    expr = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator*((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                        *)local_118);
    SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x20));
    pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)local_118);
    this_02 = local_118;
    if (pSVar13->comparison_type == INVALID) {
      this_04 = (ParserException *)__cxa_allocate_exception(0x10);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_108 + 0x20),"Unsupported comparison \"%s\" for ANY/ALL subquery",
                 "");
      local_50._0_8_ = local_50 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_90._0_8_,
                 (pointer)((long)&(((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                                     *)local_90._8_8_)->_M_t).
                                  super___uniq_ptr_impl<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::Transformer::CreatePivotEntry_*,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                                  .
                                  super__Head_base<0UL,_duckdb::Transformer::CreatePivotEntry_*,_false>
                                  ._M_head_impl + local_90._0_8_));
      ParserException::ParserException<std::__cxx11::string>
                (this_04,(string *)(local_108 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      __cxa_throw(this_04,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(int *)(in_RDX + 4) == 2) {
      pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)local_118);
      EVar8 = NegateComparisonExpression(pSVar13->comparison_type);
      pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)local_118);
      pSVar13->comparison_type = EVar8;
      this_02 = (undefined1  [8])operator_new(0x50);
      local_e8._M_dataplus._M_p = (pointer)local_118;
      local_118 = (undefined1  [8])0x0;
      local_128._0_8_ = (Transformer *)0x0;
      OperatorExpression::OperatorExpression
                ((OperatorExpression *)this_02,OPERATOR_NOT,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)(local_108 + 0x20),
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_128);
      if ((Transformer *)local_128._0_8_ != (Transformer *)0x0) {
        (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_128._0_8_)->ptr->options)();
      }
      local_128._0_8_ = (Transformer *)0x0;
      if ((Transformer *)local_e8._M_dataplus._M_p != (Transformer *)0x0) {
        (**(code **)((long)(((ParsedExpression *)local_e8._M_dataplus._M_p)->super_BaseExpression).
                           _vptr_BaseExpression + 8))();
      }
    }
    else {
      local_118 = (undefined1  [8])0x0;
    }
    (this->parent).ptr = (Transformer *)this_02;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)local_108);
    if ((ParserOptions *)local_c0._8_8_ != (ParserOptions *)0x0) {
      (**(code **)(*(long *)(bool *)local_c0._8_8_ + 8))();
    }
LAB_00ca70dc:
    if ((Transformer *)local_110._M_head_impl != (Transformer *)0x0) {
      (*((BaseExpression *)&((local_110._M_head_impl)->super_SQLStatement)._vptr_SQLStatement)->
        _vptr_BaseExpression[1])();
    }
    break;
  case 3:
    TransformExpression((Transformer *)local_128,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    TransformExpression((Transformer *)(local_128 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    pTVar19 = (Transformer *)operator_new(0x48);
    local_e8._M_dataplus._M_p = (pointer)local_128._0_8_;
    local_128._0_8_ = (Transformer *)0x0;
    local_108._0_8_ = local_128._8_8_;
    local_128._8_8_ = (Transformer *)0x0;
    ComparisonExpression::ComparisonExpression
              ((ComparisonExpression *)pTVar19,COMPARE_DISTINCT_FROM,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_108 + 0x20),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_108);
    goto LAB_00ca6ed6;
  case 4:
    TransformExpression((Transformer *)local_128,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    TransformExpression((Transformer *)(local_128 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    pTVar19 = (Transformer *)operator_new(0x48);
    local_e8._M_dataplus._M_p = (pointer)local_128._0_8_;
    local_128._0_8_ = (Transformer *)0x0;
    local_108._0_8_ = local_128._8_8_;
    local_128._8_8_ = (Transformer *)0x0;
    ComparisonExpression::ComparisonExpression
              ((ComparisonExpression *)pTVar19,COMPARE_BOUNDARY_END,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_108 + 0x20),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_108);
LAB_00ca6ed6:
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_108._0_8_ !=
        (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
      (*((BaseExpression *)&((BaseExpression *)local_108._0_8_)->_vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    local_108._0_8_ = (ParsedExpression *)0x0;
    if ((Transformer *)local_e8._M_dataplus._M_p != (Transformer *)0x0) {
      (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
    }
    (this->parent).ptr = pTVar19;
    _Var21._M_head_impl = (ParsedExpression *)local_128._0_8_;
    if ((Transformer *)local_128._8_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_128._8_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      _Var21._M_head_impl = (ParsedExpression *)local_128._0_8_;
    }
    goto LAB_00ca71dd;
  case 5:
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    TransformExpression((Transformer *)local_108,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)(local_108 + 0x20),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_108);
    if ((Transformer *)local_108._0_8_ != (Transformer *)0x0) {
      (*((BaseExpression *)&((BaseExpression *)local_108._0_8_)->_vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    TransformExpression((Transformer *)local_108,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)(local_108 + 0x20),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_108);
    if ((Transformer *)local_108._0_8_ != (Transformer *)0x0) {
      (*((BaseExpression *)&((BaseExpression *)local_108._0_8_)->_vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)local_108,(char (*) [7])"nullif",
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)(local_108 + 0x20));
    (this->parent).ptr = (Transformer *)local_108._0_8_;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)(local_108 + 0x20));
    goto LAB_00ca71e8;
  default:
    TransformExpression((Transformer *)local_108,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    op = root;
    TransformExpression((Transformer *)local_128,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    if ((Transformer *)local_108._0_8_ == (Transformer *)0x0) {
      local_c0._40_8_ = local_128._0_8_;
      local_128._0_8_ = (Transformer *)0x0;
      TransformUnaryOperator
                (this,(string *)op,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_90);
      if ((Transformer *)local_c0._40_8_ != (Transformer *)0x0) {
        (*(((ParsedExpression *)local_c0._40_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_c0._40_8_ = (_Hash_node_base *)0x0;
    }
    else {
      if ((Transformer *)local_128._0_8_ == (Transformer *)0x0) {
        pTVar19 = (Transformer *)&local_e8.field_2;
        local_e8._M_dataplus._M_p = (pointer)pTVar19;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_108 + 0x20),local_90._0_8_,
                   (pointer)((long)&(((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                                       *)local_90._8_8_)->_M_t).
                                    super___uniq_ptr_impl<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::Transformer::CreatePivotEntry_*,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                                    .
                                    super__Head_base<0UL,_duckdb::Transformer::CreatePivotEntry_*,_false>
                                    ._M_head_impl + local_90._0_8_));
        op_00 = (string *)0x138e8ac;
        ::std::__cxx11::string::append(local_108 + 0x20);
        local_c0._32_8_ = local_108._0_8_;
        local_108._0_8_ =
             (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              )0x0;
        TransformUnaryOperator
                  (this,op_00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)(local_108 + 0x20));
        if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             )local_c0._32_8_ != (ParsedExpression *)0x0) {
          (*(((ParsedExpression *)local_c0._32_8_)->super_BaseExpression)._vptr_BaseExpression[1])()
          ;
        }
        local_c0._32_8_ = (__node_base_ptr)0x0;
        _Var22._M_p = local_e8._M_dataplus._M_p;
      }
      else {
        pTVar19 = (Transformer *)(local_80 + 0x20);
        if ((Transformer *)local_90._0_8_ == (Transformer *)(local_90 + 0x10)) {
          _Stack_58._M_nxt = (_Hash_node_base *)local_80._8_8_;
          local_80._16_8_ = pTVar19;
        }
        else {
          local_80._16_8_ = local_90._0_8_;
        }
        local_80._24_8_ = local_90._8_8_;
        local_90._8_8_ = (PGList *)0x0;
        local_80[0] = '\0';
        local_c0._24_8_ = local_108._0_8_;
        local_108._0_8_ =
             (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              )0x0;
        local_c0._16_8_ = local_128._0_8_;
        local_128._0_8_ = (Transformer *)0x0;
        local_90._0_8_ = (Transformer *)(local_90 + 0x10);
        TransformBinaryOperator
                  (this,(string *)root,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)(local_80 + 0x10),
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)(local_c0 + 0x18));
        if ((Transformer *)local_c0._16_8_ != (Transformer *)0x0) {
          (*(((ParsedExpression *)local_c0._16_8_)->super_BaseExpression)._vptr_BaseExpression[1])()
          ;
        }
        local_c0._16_8_ = (_Hash_node_base *)0x0;
        if ((Transformer *)local_c0._24_8_ != (Transformer *)0x0) {
          (*(((ParsedExpression *)local_c0._24_8_)->super_BaseExpression)._vptr_BaseExpression[1])()
          ;
        }
        local_c0._24_8_ = (__buckets_ptr)0x0;
        _Var22._M_p = (pointer)local_80._16_8_;
      }
      if ((Transformer *)_Var22._M_p != pTVar19) {
        operator_delete(_Var22._M_p);
      }
    }
    _Var21._M_head_impl = (ParsedExpression *)local_108._0_8_;
    if ((Transformer *)local_128._0_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_128._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      _Var21._M_head_impl = (ParsedExpression *)local_108._0_8_;
    }
    goto LAB_00ca71dd;
  case 7:
    TransformInExpression(this,(string *)root,(PGAExpr *)local_90);
    goto LAB_00ca71e8;
  case 0xb:
    TransformExpression((Transformer *)(local_128 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    TransformExpression((Transformer *)local_c0,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root)
    ;
    local_108._0_8_ =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
    local_108._8_8_ = (_Hash_node_base *)0x0;
    local_108._16_8_ = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)local_108,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_128 + 8));
    pBVar14 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)local_c0)->super_BaseExpression;
    pFVar15 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar14);
    this_05 = &pFVar15->children;
    pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](this_05,1);
    pPVar17 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(pvVar16);
    if ((pPVar17->super_BaseExpression).type != VALUE_CONSTANT) {
      pNVar20 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_108 + 0x20),"Custom escape in SIMILAR TO","");
      NotImplementedException::NotImplementedException(pNVar20,(string *)(local_108 + 0x20));
      __cxa_throw(pNVar20,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](this_05,1);
    pBVar14 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar16)->super_BaseExpression;
    pCVar18 = BaseExpression::Cast<duckdb::ConstantExpression>(pBVar14);
    if ((pCVar18->value).is_null == false) {
      pNVar20 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_108 + 0x20),"Custom escape in SIMILAR TO","");
      NotImplementedException::NotImplementedException(pNVar20,(string *)(local_108 + 0x20));
      __cxa_throw(pNVar20,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](this_05,0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)local_108,pvVar16);
    iVar9 = ::std::__cxx11::string::compare(local_90);
    local_118 = (undefined1  [8])0x130c81e;
    make_uniq<duckdb::FunctionExpression,char_const*const&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_110,(char **)local_118,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)local_108);
    if (iVar9 == 0) {
      pTVar19 = (Transformer *)operator_new(0x50);
      local_e8._M_dataplus._M_p = (pointer)local_110._M_head_impl;
      local_110._M_head_impl = (SelectStatement *)0x0;
      local_128._0_8_ = (Transformer *)0x0;
      OperatorExpression::OperatorExpression
                ((OperatorExpression *)pTVar19,OPERATOR_NOT,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)(local_108 + 0x20),
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_128);
      if ((Transformer *)local_128._0_8_ != (Transformer *)0x0) {
        (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_128._0_8_)->ptr->options)();
      }
      local_128._0_8_ = (Transformer *)0x0;
      if ((Transformer *)local_e8._M_dataplus._M_p != (Transformer *)0x0) {
        (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
      }
      (this->parent).ptr = pTVar19;
      if ((Transformer *)local_110._M_head_impl != (Transformer *)0x0) {
        (*((BaseExpression *)&((local_110._M_head_impl)->super_SQLStatement)._vptr_SQLStatement)->
          _vptr_BaseExpression[1])();
      }
    }
    else {
      (this->parent).ptr = (Transformer *)local_110._M_head_impl;
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)local_108);
    goto LAB_00ca71c8;
  case 0xc:
  case 0xd:
    local_128._0_8_ = *(undefined8 *)(in_RDX + 0x18);
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_128);
    if (((*(int *)((long)&(((ParsedExpression *)local_128._0_8_)->super_BaseExpression).
                          _vptr_BaseExpression + 4) != 2) ||
        (optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                   ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_128),
        pPVar4 = *(ParserOptions **)(local_128._0_8_ + 8),
        lVar5._0_1_ = pPVar4->preserve_identifier_case, lVar5._1_1_ = pPVar4->integer_division,
        lVar5._2_6_ = *(undefined6 *)&pPVar4->field_0x2, lVar5 == 0)) ||
       (optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_128),
       *(long *)(((string *)(local_128._0_8_ + 0x10))->_M_dataplus)._M_p == 0)) {
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_108 + 0x20),"(NOT) BETWEEN needs two args","");
      InternalException::InternalException(this_03,(string *)(local_108 + 0x20));
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformExpression((Transformer *)(local_128 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_128);
    TransformExpression((Transformer *)local_c0,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root)
    ;
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_128);
    TransformExpression((Transformer *)local_118,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    make_uniq<duckdb::BetweenExpression,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)&local_110,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_128 + 8),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_c0,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_118);
    if (*(int *)(in_RDX + 4) != 0xc) {
      pTVar19 = (Transformer *)operator_new(0x50);
      local_e8._M_dataplus._M_p = (pointer)local_110._M_head_impl;
      local_110._M_head_impl = (SelectStatement *)0x0;
      local_108._0_8_ = (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
      OperatorExpression::OperatorExpression
                ((OperatorExpression *)pTVar19,OPERATOR_NOT,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)(local_108 + 0x20),
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_108);
      if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           )local_108._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)((long)*(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                             *)local_108._0_8_ + 8))();
      }
      local_108._0_8_ =
           (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
      if ((Transformer *)local_e8._M_dataplus._M_p != (Transformer *)0x0) {
        (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
      }
      (this->parent).ptr = pTVar19;
      goto LAB_00ca70dc;
    }
    (this->parent).ptr = (Transformer *)local_110._M_head_impl;
  }
  if (local_118 != (undefined1  [8])0x0) {
    (*(((ParsedExpression *)local_118)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
LAB_00ca71c8:
  _Var21._M_head_impl = (ParsedExpression *)local_128._8_8_;
  if ((_Hash_node_base *)local_c0._0_8_ != (_Hash_node_base *)0x0) {
    (*(code *)(*(_Hash_node_base **)local_c0._0_8_)[1]._M_nxt)();
    _Var21._M_head_impl = (ParsedExpression *)local_128._8_8_;
  }
LAB_00ca71dd:
  if ((Transformer *)_Var21._M_head_impl != (Transformer *)0x0) {
    (*((BaseExpression *)&((_Var21._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
      _vptr_BaseExpression[1])();
  }
LAB_00ca71e8:
  if ((Transformer *)local_90._0_8_ != (Transformer *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformAExprInternal(duckdb_libpgquery::PGAExpr &root) {
	auto name = string(PGPointerCast<duckdb_libpgquery::PGValue>(root.name->head->data.ptr_value)->val.str);

	switch (root.kind) {
	case duckdb_libpgquery::PG_AEXPR_OP_ALL:
	case duckdb_libpgquery::PG_AEXPR_OP_ANY: {
		// left=ANY(right)
		// we turn this into left=ANY((SELECT UNNEST(right)))
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);

		auto subquery_expr = make_uniq<SubqueryExpression>();
		auto select_statement = make_uniq<SelectStatement>();
		auto select_node = make_uniq<SelectNode>();
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(right_expr));

		select_node->select_list.push_back(make_uniq<FunctionExpression>("UNNEST", std::move(children)));
		select_node->from_table = make_uniq<EmptyTableRef>();
		select_statement->node = std::move(select_node);
		subquery_expr->subquery = std::move(select_statement);
		subquery_expr->subquery_type = SubqueryType::ANY;
		subquery_expr->child = std::move(left_expr);
		subquery_expr->comparison_type = OperatorToExpressionType(name);
		SetQueryLocation(*subquery_expr, root.location);
		if (subquery_expr->comparison_type == ExpressionType::INVALID) {
			throw ParserException("Unsupported comparison \"%s\" for ANY/ALL subquery", name);
		}

		if (root.kind == duckdb_libpgquery::PG_AEXPR_OP_ALL) {
			// ALL sublink is equivalent to NOT(ANY) with inverted comparison
			// e.g. [= ALL()] is equivalent to [NOT(<> ANY())]
			// first invert the comparison type
			subquery_expr->comparison_type = NegateComparisonExpression(subquery_expr->comparison_type);
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(subquery_expr));
		}
		return std::move(subquery_expr);
	}
	case duckdb_libpgquery::PG_AEXPR_IN: {
		return TransformInExpression(name, root);
	}
	// rewrite NULLIF(a, b) into CASE WHEN a=b THEN NULL ELSE a END
	case duckdb_libpgquery::PG_AEXPR_NULLIF: {
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(TransformExpression(root.lexpr));
		children.push_back(TransformExpression(root.rexpr));
		return make_uniq<FunctionExpression>("nullif", std::move(children));
	}
	// rewrite (NOT) X BETWEEN A AND B into (NOT) AND(GREATERTHANOREQUALTO(X,
	// A), LESSTHANOREQUALTO(X, B))
	case duckdb_libpgquery::PG_AEXPR_BETWEEN:
	case duckdb_libpgquery::PG_AEXPR_NOT_BETWEEN: {
		auto between_args = PGPointerCast<duckdb_libpgquery::PGList>(root.rexpr);
		if (between_args->length != 2 || !between_args->head->data.ptr_value || !between_args->tail->data.ptr_value) {
			throw InternalException("(NOT) BETWEEN needs two args");
		}

		auto input = TransformExpression(root.lexpr);
		auto between_left =
		    TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(between_args->head->data.ptr_value));
		auto between_right =
		    TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(between_args->tail->data.ptr_value));

		auto compare_between =
		    make_uniq<BetweenExpression>(std::move(input), std::move(between_left), std::move(between_right));
		if (root.kind == duckdb_libpgquery::PG_AEXPR_BETWEEN) {
			return std::move(compare_between);
		} else {
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(compare_between));
		}
	}
	// rewrite SIMILAR TO into regexp_full_match('asdf', '.*sd.*')
	case duckdb_libpgquery::PG_AEXPR_SIMILAR: {
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);

		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(left_expr));

		auto &similar_func = right_expr->Cast<FunctionExpression>();
		D_ASSERT(similar_func.function_name == "similar_escape");
		D_ASSERT(similar_func.children.size() == 2);
		if (similar_func.children[1]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
			throw NotImplementedException("Custom escape in SIMILAR TO");
		}
		auto &constant = similar_func.children[1]->Cast<ConstantExpression>();
		if (!constant.value.IsNull()) {
			throw NotImplementedException("Custom escape in SIMILAR TO");
		}
		// take the child of the similar_func
		children.push_back(std::move(similar_func.children[0]));

		// this looks very odd, but seems to be the way to find out its NOT IN
		bool invert_similar = false;
		if (name == "!~") {
			// NOT SIMILAR TO
			invert_similar = true;
		}
		const auto regex_function = "regexp_full_match";
		auto result = make_uniq<FunctionExpression>(regex_function, std::move(children));

		if (invert_similar) {
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(result));
		} else {
			return std::move(result);
		}
	}
	case duckdb_libpgquery::PG_AEXPR_NOT_DISTINCT: {
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);
		return make_uniq<ComparisonExpression>(ExpressionType::COMPARE_NOT_DISTINCT_FROM, std::move(left_expr),
		                                       std::move(right_expr));
	}
	case duckdb_libpgquery::PG_AEXPR_DISTINCT: {
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);
		return make_uniq<ComparisonExpression>(ExpressionType::COMPARE_DISTINCT_FROM, std::move(left_expr),
		                                       std::move(right_expr));
	}

	default:
		break;
	}
	auto left_expr = TransformExpression(root.lexpr);
	auto right_expr = TransformExpression(root.rexpr);

	if (!left_expr) {
		// prefix operator
		return TransformUnaryOperator(name, std::move(right_expr));
	} else if (!right_expr) {
		// postfix operator, only ! is currently supported
		return TransformUnaryOperator(name + "__postfix", std::move(left_expr));
	} else {
		return TransformBinaryOperator(std::move(name), std::move(left_expr), std::move(right_expr));
	}
}